

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdOutput.h
# Opt level: O0

void __thiscall TCLAP::StdOutput::_shortUsage(StdOutput *this,CmdLineInterface *_cmd,ostream *os)

{
  Arg *pAVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
  *__x;
  ulong uVar4;
  size_type sVar5;
  reference pvVar6;
  reference ppAVar7;
  undefined1 *puVar8;
  reference ppAVar9;
  int local_1c4;
  int secondLineOffset;
  allocator local_1b1;
  string local_1b0 [32];
  string local_190 [32];
  string local_170 [32];
  _Self local_150;
  _Self local_148;
  ArgListIterator it_1;
  allocator local_131;
  string local_130 [32];
  string local_110 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0 [32];
  __normal_iterator<TCLAP::Arg_**,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>
  local_d0;
  __normal_iterator<TCLAP::Arg_**,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>
  local_c8;
  ArgVectorIterator it;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8 [4];
  int i;
  string s;
  undefined1 local_98 [8];
  vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
  xorList;
  XorHandler xorHandler;
  string local_58 [8];
  string progName;
  undefined1 local_38 [8];
  list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> argList;
  ostream *os_local;
  CmdLineInterface *_cmd_local;
  StdOutput *this_local;
  
  argList.super__List_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>._M_impl._M_node._M_size =
       (size_t)os;
  iVar3 = (*_cmd->_vptr_CmdLineInterface[0xb])();
  std::__cxx11::list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::list
            ((list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> *)local_38,
             (list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> *)CONCAT44(extraout_var,iVar3));
  iVar3 = (*_cmd->_vptr_CmdLineInterface[10])();
  std::__cxx11::string::string(local_58,(string *)CONCAT44(extraout_var_00,iVar3));
  iVar3 = (*_cmd->_vptr_CmdLineInterface[0xc])();
  XorHandler::XorHandler
            ((XorHandler *)
             &xorList.
              super__Vector_base<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (XorHandler *)CONCAT44(extraout_var_01,iVar3));
  __x = XorHandler::getXorList
                  ((XorHandler *)
                   &xorList.
                    super__Vector_base<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
  ::vector((vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
            *)local_98,__x);
  std::operator+(local_b8,(char *)local_58);
  it._M_current._4_4_ = 0;
  while( true ) {
    uVar4 = (ulong)it._M_current._4_4_;
    sVar5 = std::
            vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
            ::size((vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
                    *)local_98);
    if (sVar5 <= uVar4) break;
    std::__cxx11::string::operator+=((string *)local_b8," {");
    pvVar6 = std::
             vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
             ::operator[]((vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
                           *)local_98,(long)(int)it._M_current._4_4_);
    local_c8._M_current =
         (Arg **)std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::begin(pvVar6);
    while( true ) {
      pvVar6 = std::
               vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
               ::operator[]((vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
                             *)local_98,(long)(int)it._M_current._4_4_);
      local_d0._M_current =
           (Arg **)std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::end(pvVar6);
      bVar2 = __gnu_cxx::operator!=(&local_c8,&local_d0);
      if (!bVar2) break;
      ppAVar7 = __gnu_cxx::
                __normal_iterator<TCLAP::Arg_**,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>
                ::operator*(&local_c8);
      pAVar1 = *ppAVar7;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_130,"val",&local_131);
      (*pAVar1->_vptr_Arg[8])(local_110,pAVar1,local_130);
      std::operator+(local_f0,(char *)local_110);
      std::__cxx11::string::operator+=((string *)local_b8,(string *)local_f0);
      std::__cxx11::string::~string((string *)local_f0);
      std::__cxx11::string::~string(local_110);
      std::__cxx11::string::~string(local_130);
      std::allocator<char>::~allocator((allocator<char> *)&local_131);
      it_1._M_node = (_List_node_base *)
                     __gnu_cxx::
                     __normal_iterator<TCLAP::Arg_**,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>
                     ::operator++(&local_c8,0);
    }
    std::__cxx11::string::length();
    puVar8 = (undefined1 *)std::__cxx11::string::operator[]((ulong)local_b8);
    *puVar8 = 0x7d;
    it._M_current._4_4_ = it._M_current._4_4_ + 1;
  }
  local_148._M_node =
       (_List_node_base *)
       std::__cxx11::list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::begin
                 ((list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> *)local_38);
  while( true ) {
    local_150._M_node =
         (_List_node_base *)
         std::__cxx11::list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::end
                   ((list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> *)local_38);
    bVar2 = std::operator!=(&local_148,&local_150);
    if (!bVar2) break;
    ppAVar9 = std::_List_iterator<TCLAP::Arg_*>::operator*(&local_148);
    bVar2 = XorHandler::contains
                      ((XorHandler *)
                       &xorList.
                        super__Vector_base<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,*ppAVar9);
    if (!bVar2) {
      ppAVar9 = std::_List_iterator<TCLAP::Arg_*>::operator*(&local_148);
      pAVar1 = *ppAVar9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1b0,"val",&local_1b1);
      (*pAVar1->_vptr_Arg[8])(local_190,pAVar1,local_1b0);
      std::operator+((char *)local_170,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x19c694);
      std::__cxx11::string::operator+=((string *)local_b8,local_170);
      std::__cxx11::string::~string(local_170);
      std::__cxx11::string::~string(local_190);
      std::__cxx11::string::~string(local_1b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
    }
    std::_List_iterator<TCLAP::Arg_*>::operator++(&local_148,0);
  }
  local_1c4 = std::__cxx11::string::length();
  local_1c4 = local_1c4 + 2;
  if (0x25 < local_1c4) {
    local_1c4 = 0x25;
  }
  spacePrint(this,(ostream *)
                  argList.super__List_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>._M_impl.
                  _M_node._M_size,local_b8,0x4b,3,local_1c4);
  std::__cxx11::string::~string((string *)local_b8);
  std::
  vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
  ::~vector((vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
             *)local_98);
  XorHandler::~XorHandler
            ((XorHandler *)
             &xorList.
              super__Vector_base<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::~list
            ((list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> *)local_38);
  return;
}

Assistant:

inline void 
StdOutput::_shortUsage( CmdLineInterface& _cmd, 
						std::ostream& os ) const
{
	std::list<Arg*> argList = _cmd.getArgList();
	std::string progName = _cmd.getProgramName();
	XorHandler xorHandler = _cmd.getXorHandler();
	std::vector< std::vector<Arg*> > xorList = xorHandler.getXorList();

	std::string s = progName + " ";

	// first the xor
	for ( int i = 0; static_cast<unsigned int>(i) < xorList.size(); i++ )
		{
			s += " {";
			for ( ArgVectorIterator it = xorList[i].begin(); 
				  it != xorList[i].end(); it++ )
				s += (*it)->shortID() + "|";

			s[s.length()-1] = '}';
		}

	// then the rest
	for (ArgListIterator it = argList.begin(); it != argList.end(); it++)
		if ( !xorHandler.contains( (*it) ) )
			s += " " + (*it)->shortID();

	// if the program name is too long, then adjust the second line offset 
	int secondLineOffset = static_cast<int>(progName.length()) + 2;
	if ( secondLineOffset > 75/2 )
		secondLineOffset = static_cast<int>(75/2);

	spacePrint( os, s, 75, 3, secondLineOffset );
}